

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_z5_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
                *matrix)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_08;
  reference pvVar1;
  uint local_338 [8];
  iterator local_318;
  undefined8 local_310;
  int local_308 [10];
  pair<unsigned_int,_unsigned_int> local_2e0;
  pair<unsigned_int,_unsigned_int> local_2d8;
  pair<unsigned_int,_unsigned_int> local_2d0;
  pair<unsigned_int,_unsigned_int> local_2c8;
  pair<unsigned_int,_unsigned_int> local_2c0;
  iterator local_2b8;
  undefined8 local_2b0;
  uint local_2a8 [8];
  iterator local_288;
  undefined8 local_280;
  int local_278 [8];
  pair<unsigned_int,_unsigned_int> local_258;
  pair<unsigned_int,_unsigned_int> local_250;
  pair<unsigned_int,_unsigned_int> local_248;
  pair<unsigned_int,_unsigned_int> local_240;
  iterator local_238;
  undefined8 local_230;
  initializer_list<unsigned_int> local_228;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_218;
  uint local_208 [8];
  iterator local_1e8;
  undefined8 local_1e0;
  int local_1d8 [10];
  pair<unsigned_int,_unsigned_int> local_1b0;
  pair<unsigned_int,_unsigned_int> local_1a8;
  pair<unsigned_int,_unsigned_int> local_1a0;
  pair<unsigned_int,_unsigned_int> local_198;
  pair<unsigned_int,_unsigned_int> local_190;
  iterator local_188;
  undefined8 local_180;
  uint local_178 [8];
  iterator local_158;
  undefined8 local_150;
  int local_148 [10];
  pair<unsigned_int,_unsigned_int> local_120;
  pair<unsigned_int,_unsigned_int> local_118;
  pair<unsigned_int,_unsigned_int> local_110;
  pair<unsigned_int,_unsigned_int> local_108;
  pair<unsigned_int,_unsigned_int> local_100;
  iterator local_f8;
  undefined8 local_f0;
  uint local_e8 [8];
  iterator local_c8;
  undefined8 local_c0;
  int local_b4 [9];
  int local_90 [2];
  pair<unsigned_int,_unsigned_int> local_88;
  pair<unsigned_int,_unsigned_int> local_80;
  pair<unsigned_int,_unsigned_int> local_78;
  pair<unsigned_int,_unsigned_int> local_70;
  iterator local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  setcont;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
  *matrix_local;
  
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::set((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_90[1] = 0;
  local_90[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_88,local_90 + 1,local_90);
  local_b4[5] = 1;
  local_b4[4] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_80,local_b4 + 5,local_b4 + 4);
  local_b4[3] = 3;
  local_b4[2] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_78,local_b4 + 3,local_b4 + 2);
  local_b4[1] = 5;
  local_b4[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_70,local_b4 + 1,local_b4);
  local_68 = &local_88;
  local_60 = 4;
  __l_08._M_len = 4;
  __l_08._M_array = local_68;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_08);
  local_e8[0] = 1;
  local_e8[1] = 2;
  local_e8[2] = 0;
  local_e8[3] = 3;
  local_e8[4] = 0;
  local_e8[5] = 4;
  local_c8 = local_e8;
  local_c0 = 6;
  __l_07._M_len = 6;
  __l_07._M_array = local_c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_07);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar1,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_148[9] = 0;
  local_148[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_120,local_148 + 9,local_148 + 8);
  local_148[7] = 1;
  local_148[6] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_118,local_148 + 7,local_148 + 6);
  local_148[5] = 2;
  local_148[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_110,local_148 + 5,local_148 + 4);
  local_148[3] = 5;
  local_148[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_108,local_148 + 3,local_148 + 2);
  local_148[1] = 6;
  local_148[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_100,local_148 + 1,local_148);
  local_f8 = &local_120;
  local_f0 = 5;
  __l_06._M_len = 5;
  __l_06._M_array = local_f8;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_06);
  local_178[4] = 0;
  local_178[5] = 1;
  local_178[6] = 1;
  local_178[0] = 4;
  local_178[1] = 2;
  local_178[2] = 1;
  local_178[3] = 0;
  local_158 = local_178;
  local_150 = 7;
  __l_05._M_len = 7;
  __l_05._M_array = local_158;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_05);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
           ::operator[](matrix,1);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar1,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_1d8[9] = 0;
  local_1d8[8] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_1b0,local_1d8 + 9,local_1d8 + 8);
  local_1d8[7] = 1;
  local_1d8[6] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_1a8,local_1d8 + 7,local_1d8 + 6);
  local_1d8[5] = 2;
  local_1d8[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_1a0,local_1d8 + 5,local_1d8 + 4);
  local_1d8[3] = 5;
  local_1d8[2] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_198,local_1d8 + 3,local_1d8 + 2);
  local_1d8[1] = 6;
  local_1d8[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_190,local_1d8 + 1,local_1d8);
  local_188 = &local_1b0;
  local_180 = 5;
  __l_04._M_len = 5;
  __l_04._M_array = local_188;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_04);
  local_208[4] = 0;
  local_208[5] = 4;
  local_208[6] = 4;
  local_208[0] = 1;
  local_208[1] = 3;
  local_208[2] = 4;
  local_208[3] = 0;
  local_1e8 = local_208;
  local_1e0 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_1e8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_03);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
           ::operator[](matrix,2);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar1,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_218);
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_218);
  std::initializer_list<unsigned_int>::initializer_list(&local_228);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,local_228);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
           ::operator[](matrix,3);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar1,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_278[7] = 0;
  local_278[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_258,local_278 + 7,local_278 + 6);
  local_278[5] = 1;
  local_278[4] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_250,local_278 + 5,local_278 + 4);
  local_278[3] = 3;
  local_278[2] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_248,local_278 + 3,local_278 + 2);
  local_278[1] = 5;
  local_278[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_240,local_278 + 1,local_278);
  local_238 = &local_258;
  local_230 = 4;
  __l_02._M_len = 4;
  __l_02._M_array = local_238;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_02);
  local_2a8[0] = 1;
  local_2a8[1] = 2;
  local_2a8[2] = 0;
  local_2a8[3] = 3;
  local_2a8[4] = 0;
  local_2a8[5] = 4;
  local_288 = local_2a8;
  local_280 = 6;
  __l_01._M_len = 6;
  __l_01._M_array = local_288;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_01);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
           ::operator[](matrix,4);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar1,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_308[9] = 0;
  local_308[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2e0,local_308 + 9,local_308 + 8);
  local_308[7] = 1;
  local_308[6] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2d8,local_308 + 7,local_308 + 6);
  local_308[5] = 2;
  local_308[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2d0,local_308 + 5,local_308 + 4);
  local_308[3] = 5;
  local_308[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2c8,local_308 + 3,local_308 + 2);
  local_308[1] = 6;
  local_308[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_2c0,local_308 + 1,local_308);
  local_2b8 = &local_2e0;
  local_2b0 = 5;
  __l_00._M_len = 5;
  __l_00._M_array = local_2b8;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_00);
  local_338[4] = 0;
  local_338[5] = 1;
  local_338[6] = 1;
  local_338[0] = 4;
  local_338[1] = 2;
  local_338[2] = 1;
  local_338[3] = 0;
  local_318 = local_338;
  local_310 = 7;
  __l._M_len = 7;
  __l._M_array = local_318;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l);
  pvVar1 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar1,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~set((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void column_test_common_z5_content_access(std::vector<Column>& matrix) {
  std::set<std::pair<unsigned int, typename Column::Field_element> > setcont;
  std::vector<typename Column::Field_element> veccont;

  setcont = {{0, 1}, {1, 2}, {3, 3}, {5, 4}};
  veccont = {1, 2, 0, 3, 0, 4};
  column_test_common_content_access(matrix[0], setcont, veccont);

  setcont = {{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}};
  veccont = {4, 2, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[1], setcont, veccont);

  setcont = {{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}};
  veccont = {1, 3, 4, 0, 0, 4, 4};
  column_test_common_content_access(matrix[2], setcont, veccont);

  setcont = {};
  veccont = {};
  column_test_common_content_access(matrix[3], setcont, veccont);

  setcont = {{0, 1}, {1, 2}, {3, 3}, {5, 4}};
  veccont = {1, 2, 0, 3, 0, 4};
  column_test_common_content_access(matrix[4], setcont, veccont);

  setcont = {{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}};
  veccont = {4, 2, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
}